

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_metadata.cpp
# Opt level: O2

void __thiscall
libtorrent::anon_unknown_0::ut_metadata_peer_plugin::add_handshake
          (ut_metadata_peer_plugin *this,entry *h)

{
  int iVar1;
  entry *peVar2;
  string_view key;
  string_view key_00;
  string_view key_01;
  
  key.len_ = 1;
  key.ptr_ = "m";
  peVar2 = entry::operator[](h,key);
  key_00.len_ = 0xb;
  key_00.ptr_ = "ut_metadata";
  peVar2 = entry::operator[](peVar2,key_00);
  entry::operator=(peVar2,2);
  if (0 < (((this->m_torrent->super_torrent_hot_members).m_torrent_file.
            super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          m_files).m_piece_length) {
    iVar1 = this->m_tp->m_metadata_size;
    key_01.len_ = 0xd;
    key_01.ptr_ = "metadata_size";
    peVar2 = entry::operator[](h,key_01);
    entry::operator=(peVar2,(long)iVar1);
    return;
  }
  return;
}

Assistant:

void add_handshake(entry& h) override
		{
			entry& messages = h["m"];
			messages["ut_metadata"] = 2;
			if (m_torrent.valid_metadata())
				h["metadata_size"] = m_tp.get_metadata_size();
		}